

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# densehashtable.h
# Opt level: O1

pointer __thiscall
google::
dense_hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_google::dense_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_google::libc_allocator_with_realloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>::Identity,_google::dense_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_google::libc_allocator_with_realloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>::SetKey,_Hasher,_google::libc_allocator_with_realloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
::
alloc_impl<google::libc_allocator_with_realloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
::realloc_or_die(alloc_impl<google::libc_allocator_with_realloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *this,pointer ptr,size_type n)

{
  long lVar1;
  bool bVar2;
  pointer pbVar3;
  pointer extraout_RAX;
  undefined7 extraout_var;
  undefined7 extraout_var_00;
  string *b;
  
  pbVar3 = (pointer)realloc(ptr,n << 5);
  if (pbVar3 != (pointer)0x0) {
    return pbVar3;
  }
  dense_hashtable<std::__cxx11::string,std::__cxx11::string,Hasher,google::dense_hash_set<std::__cxx11::string,Hasher,Hasher,google::libc_allocator_with_realloc<std::__cxx11::string>>::Identity,google::dense_hash_set<std::__cxx11::string,Hasher,Hasher,google::libc_allocator_with_realloc<std::__cxx11::string>>::SetKey,Hasher,google::libc_allocator_with_realloc<std::__cxx11::string>>
  ::alloc_impl<google::libc_allocator_with_realloc<std::__cxx11::string>>::realloc_or_die();
  b = *(string **)(n + 8);
  pbVar3 = extraout_RAX;
  if (b != *(string **)(n + 0x10)) {
    do {
      bVar2 = Hasher::operator()((Hasher *)(*(long *)n + 0x30),(string *)(*(long *)n + 0x60),b);
      pbVar3 = (pointer)CONCAT71(extraout_var,bVar2);
      if (!bVar2) {
        lVar1 = *(long *)n;
        if (*(long *)(lVar1 + 0x80) == 0) {
          return pbVar3;
        }
        bVar2 = Hasher::operator()((Hasher *)(lVar1 + 0x30),(string *)(lVar1 + 0x40),
                                   *(string **)(n + 8));
        pbVar3 = (pointer)CONCAT71(extraout_var_00,bVar2);
        if (!bVar2) {
          return pbVar3;
        }
      }
      b = (string *)(*(long *)(n + 8) + 0x20);
      *(string **)(n + 8) = b;
    } while (b != *(string **)(n + 0x10));
  }
  return pbVar3;
}

Assistant:

pointer realloc_or_die(pointer ptr, size_type n) {
      pointer retval = this->reallocate(ptr, n);
      if (retval == NULL) {
        fprintf(stderr,
                "sparsehash: FATAL ERROR: failed to reallocate "
                "%lu elements for ptr %p",
                static_cast<unsigned long>(n), static_cast<void*>(ptr));
        exit(1);
      }
      return retval;
    }